

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O0

int Fraig_CompareSimInfo(Fraig_Node_t *pNode1,Fraig_Node_t *pNode2,int iWordLast,int fUseRand)

{
  int local_2c;
  int i;
  int fUseRand_local;
  int iWordLast_local;
  Fraig_Node_t *pNode2_local;
  Fraig_Node_t *pNode1_local;
  
  if (((ulong)pNode1 & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigTable.c"
                  ,0x162,"int Fraig_CompareSimInfo(Fraig_Node_t *, Fraig_Node_t *, int, int)");
  }
  if (((ulong)pNode2 & 1) == 0) {
    if (fUseRand == 0) {
      if (pNode1->uHashD != pNode2->uHashD) {
        return 0;
      }
      for (local_2c = 0; local_2c < iWordLast; local_2c = local_2c + 1) {
        if (pNode1->puSimD[local_2c] != pNode2->puSimD[local_2c]) {
          return 0;
        }
      }
    }
    else {
      if (pNode1->uHashR != pNode2->uHashR) {
        return 0;
      }
      for (local_2c = 0; local_2c < iWordLast; local_2c = local_2c + 1) {
        if (pNode1->puSimR[local_2c] != pNode2->puSimR[local_2c]) {
          return 0;
        }
      }
    }
    return 1;
  }
  __assert_fail("!Fraig_IsComplement(pNode2)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigTable.c"
                ,0x163,"int Fraig_CompareSimInfo(Fraig_Node_t *, Fraig_Node_t *, int, int)");
}

Assistant:

int Fraig_CompareSimInfo( Fraig_Node_t * pNode1, Fraig_Node_t * pNode2, int iWordLast, int fUseRand )
{
    int i;
    assert( !Fraig_IsComplement(pNode1) );
    assert( !Fraig_IsComplement(pNode2) );
    if ( fUseRand )
    {
        // if their signatures differ, skip
        if ( pNode1->uHashR != pNode2->uHashR )
            return 0;
        // check the simulation info
        for ( i = 0; i < iWordLast; i++ )
            if ( pNode1->puSimR[i] != pNode2->puSimR[i] )
                return 0;
    }
    else
    {
        // if their signatures differ, skip
        if ( pNode1->uHashD != pNode2->uHashD )
            return 0;
        // check the simulation info
        for ( i = 0; i < iWordLast; i++ )
            if ( pNode1->puSimD[i] != pNode2->puSimD[i] )
                return 0;
    }
    return 1;
}